

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

int ixmlElement_removeAttributeNode(IXML_Element *element,IXML_Attr *oldAttr,IXML_Attr **rtAttr)

{
  Nodeptr_conflict p_Var1;
  Nodeptr_conflict p_Var2;
  IXML_Attr *pIVar3;
  IXML_Node_conflict *nextSib;
  IXML_Node_conflict *preSib;
  IXML_Node_conflict *attrNode;
  IXML_Attr **rtAttr_local;
  IXML_Attr *oldAttr_local;
  IXML_Element *element_local;
  
  if ((element == (IXML_Element *)0x0) || (oldAttr == (IXML_Attr *)0x0)) {
    element_local._4_4_ = 0x69;
  }
  else {
    pIVar3 = (IXML_Attr *)ixmlElement_findAttributeNode(element,oldAttr);
    if (pIVar3 == (IXML_Attr *)0x0) {
      element_local._4_4_ = 8;
    }
    else {
      p_Var1 = (pIVar3->n).prevSibling;
      p_Var2 = (pIVar3->n).nextSibling;
      if (p_Var1 != (Nodeptr_conflict)0x0) {
        p_Var1->nextSibling = p_Var2;
      }
      if (p_Var2 != (Nodeptr_conflict)0x0) {
        p_Var2->prevSibling = p_Var1;
      }
      if ((IXML_Attr *)(element->n).firstAttr == pIVar3) {
        (element->n).firstAttr = p_Var2;
      }
      (pIVar3->n).parentNode = (Nodeptr_conflict)0x0;
      (pIVar3->n).prevSibling = (Nodeptr_conflict)0x0;
      (pIVar3->n).nextSibling = (Nodeptr_conflict)0x0;
      *rtAttr = pIVar3;
      element_local._4_4_ = 0;
    }
  }
  return element_local._4_4_;
}

Assistant:

int ixmlElement_removeAttributeNode(
	IXML_Element *element, IXML_Attr *oldAttr, IXML_Attr **rtAttr)
{
	IXML_Node *attrNode;
	IXML_Node *preSib;
	IXML_Node *nextSib;

	if (element == NULL || oldAttr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	attrNode = ixmlElement_findAttributeNode(element, oldAttr);
	if (attrNode != NULL) {
		/* Has the attribute */
		preSib = attrNode->prevSibling;
		nextSib = attrNode->nextSibling;
		if (preSib != NULL) {
			preSib->nextSibling = nextSib;
		}
		if (nextSib != NULL) {
			nextSib->prevSibling = preSib;
		}
		if (element->n.firstAttr == attrNode) {
			element->n.firstAttr = nextSib;
		}
		attrNode->parentNode = NULL;
		attrNode->prevSibling = NULL;
		attrNode->nextSibling = NULL;
		*rtAttr = (IXML_Attr *)attrNode;
		return IXML_SUCCESS;
	} else {
		return IXML_NOT_FOUND_ERR;
	}
}